

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomBuilder.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  undefined8 uVar2;
  reference pvVar3;
  reference pvVar4;
  double *pdVar5;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *__g;
  SimInfo *info;
  string *filename;
  SnapshotManager *this;
  size_type sVar6;
  pointer piVar7;
  void *pvVar8;
  Molecule *extraout_XMM0_Qa;
  double dVar9;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  Snapshot *this_00;
  int n;
  size_t i_7;
  int l;
  Molecule *mol;
  mt19937 gen;
  random_device rd;
  size_t i_6;
  vector<int,_std::allocator<int>_> ids;
  SimInfo *newInfo;
  SimCreator newCreator;
  int l_1;
  int k;
  int j;
  int i_5;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> orientations;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> sites;
  RealType avgMass;
  size_t i_4;
  RealType totalMass;
  int totalMolecules;
  size_t i_3;
  int remaining;
  size_t i_2;
  RealType totalFraction;
  size_t i_1;
  RealType remainingFraction;
  size_t i;
  size_t nComponents;
  vector<int,_std::allocator<int>_> nMol;
  vector<double,_std::allocator<double>_> molecularMasses;
  vector<double,_std::allocator<double>_> molFractions;
  vector<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_> components;
  Globals *simParams;
  SimInfo *oldInfo;
  SimCreator oldCreator;
  int nSites;
  DumpWriter *writer;
  int nMolPerCell;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> latticeOrt;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> latticePos;
  MoLocator *locator;
  Mat3x3d hmat;
  int nz;
  int ny;
  int nx;
  RealType density;
  RealType rhoConvertConst;
  vector<double,_std::allocator<double>_> lc;
  RealType latticeConstant;
  Lattice *simpleLat;
  string outputFileName;
  string inputFileName;
  string latticeType;
  gengetopt_args_info args_info;
  vector<int,_std::allocator<int>_> *in_stack_0000d6f0;
  string *in_stack_0000d6f8;
  string *in_stack_0000d700;
  undefined1 in_stack_0000dcb7;
  string *in_stack_0000dcb8;
  SimCreator *in_stack_0000dcc0;
  undefined4 in_stack_ffffffffffffd288;
  int in_stack_ffffffffffffd28c;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_ffffffffffffd290;
  errorStruct *peVar10;
  value_type *in_stack_ffffffffffffd298;
  errorStruct *in_stack_ffffffffffffd2a0;
  MoleculeStamp *in_stack_ffffffffffffd2a8;
  SimInfo *in_stack_ffffffffffffd2b0;
  undefined4 in_stack_ffffffffffffd2d0;
  undefined4 in_stack_ffffffffffffd2d4;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffd2d8;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffd2e0;
  ForceField *in_stack_ffffffffffffd2e8;
  MoleculeStamp *in_stack_ffffffffffffd2f0;
  Molecule *mol_00;
  Vector3d *in_stack_ffffffffffffd410;
  errorStruct *in_stack_ffffffffffffd418;
  MoLocator *in_stack_ffffffffffffd420;
  int local_2b64;
  _Base_ptr local_2b60;
  int local_2b54;
  ulong local_420;
  undefined1 local_418 [136];
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> local_390 [2];
  _Base_ptr local_360;
  _Base_ptr local_358;
  _Base_ptr local_350;
  double local_348;
  int local_340;
  int local_33c;
  pointer local_338;
  int local_32c;
  _Base_ptr local_328;
  pointer local_320;
  pointer local_318;
  pointer local_310;
  _Base_ptr local_308;
  pointer local_300;
  _Base_ptr local_2f8;
  undefined1 local_2c0 [48];
  Globals *local_290;
  SimInfo *local_288;
  int local_254;
  void *local_250;
  int local_244;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> local_240;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> local_228;
  pointer local_210;
  RectMatrix<double,_3U,_3U> local_1f8;
  int local_1ac;
  int local_1a8;
  int local_1a4;
  _List_node_base *local_1a0;
  _Base_ptr local_198;
  undefined1 local_190 [24];
  pointer local_178;
  Lattice *local_170;
  string local_168 [32];
  string local_148 [32];
  string local_128 [48];
  _List_node_base *local_f8;
  _List_node_base *local_e0;
  int local_c8;
  int local_b0;
  int local_98;
  _List_node_base *local_60;
  uint local_2c;
  int local_28;
  undefined8 *local_20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_18;
  int local_4;
  
  local_4 = 0;
  OpenMD::registerLattice();
  std::__cxx11::string::string(local_128);
  std::__cxx11::string::string(local_148);
  std::__cxx11::string::string(local_168);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x13282a);
  local_198 = (_Base_ptr)0x3ffa9374bc6a7efa;
  OpenMD::SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x132849);
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
            ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)0x132858)
  ;
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
            ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)0x132865)
  ;
  iVar1 = cmdline_parser((int)((ulong)in_stack_ffffffffffffd290 >> 0x20),
                         (char **)CONCAT44(in_stack_ffffffffffffd28c,in_stack_ffffffffffffd288),
                         (gengetopt_args_info *)0x132881);
  if (iVar1 == 0) {
    local_1a0 = local_e0;
    std::__cxx11::string::operator=(local_128,"FCC");
    if (local_28 != 0) {
      std::__cxx11::string::operator=(local_128,(char *)local_60);
    }
    OpenMD::LatticeFactory::getInstance();
    local_170 = OpenMD::LatticeFactory::createLattice
                          ((LatticeFactory *)in_stack_ffffffffffffd2a8,
                           (string *)in_stack_ffffffffffffd2a0);
    if (local_170 == (Lattice *)0x0) {
      uVar2 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Lattice Factory can not create %s lattice\n",uVar2);
      painCave.isFatal = 1;
      simError();
    }
    local_244 = OpenMD::Lattice::getNumSitesPerCell(local_170);
    local_1a4 = local_c8;
    if (local_c8 < 1) {
      snprintf(painCave.errMsg,2000,
               "The number of unit cells in the x direction must be greater than 0.");
      painCave.isFatal = 1;
      simError();
    }
    local_1a8 = local_b0;
    if (local_b0 < 1) {
      snprintf(painCave.errMsg,2000,
               "The number of unit cells in the y direction must be greater than 0.");
      painCave.isFatal = 1;
      simError();
    }
    local_1ac = local_98;
    if (local_98 < 1) {
      snprintf(painCave.errMsg,2000,
               "The number of unit cells in the z direction must be greater than 0.");
      painCave.isFatal = 1;
      simError();
    }
    local_254 = local_244 * local_1a4 * local_1a8 * local_1ac;
    if (local_18._M_allocated_capacity._0_4_ == 0) {
      snprintf(painCave.errMsg,2000,"No input .omd file name was specified on the command line");
      painCave.isFatal = 1;
      simError();
    }
    else {
      std::__cxx11::string::operator=(local_148,(char *)*local_20);
    }
    OpenMD::SimCreator::SimCreator((SimCreator *)0x132b74);
    local_288 = OpenMD::SimCreator::createSim
                          (in_stack_0000dcc0,in_stack_0000dcb8,(bool)in_stack_0000dcb7);
    local_290 = OpenMD::SimInfo::getSimParams(local_288);
    OpenMD::Globals::getComponents
              ((Globals *)CONCAT44(in_stack_ffffffffffffd28c,in_stack_ffffffffffffd288));
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x132bf0);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x132bfd);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x132c0a);
    peVar10 = (errorStruct *)(local_2c0 + 0x18);
    local_2f8 = (_Base_ptr)
                std::vector<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>::size
                          ((vector<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_> *)
                           peVar10);
    if (local_2f8 == (_Base_ptr)0x1) {
      local_300 = (pointer)0x3ff0000000000000;
      peVar10 = (errorStruct *)local_2c0;
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd290,
                 (value_type_conflict2 *)
                 CONCAT44(in_stack_ffffffffffffd28c,in_stack_ffffffffffffd288));
    }
    else if ((_Base_ptr)(ulong)local_2c == local_2f8) {
      for (local_308 = (_Base_ptr)0x0; local_308 < local_2f8;
          local_308 = (_Base_ptr)((long)&local_308->_M_color + 1)) {
        peVar10 = (errorStruct *)local_2c0;
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd2a0,
                   (value_type_conflict2 *)in_stack_ffffffffffffd298);
      }
    }
    else if ((undefined1 *)(ulong)local_2c == (undefined1 *)((long)&local_2f8[-1]._M_right + 7U)) {
      local_310 = (pointer)0x3ff0000000000000;
      for (local_318 = (pointer)0x0; local_318 < (pointer)((long)&local_2f8[-1]._M_right + 7U);
          local_318 = (pointer)((long)local_318 + 1)) {
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd2a0,
                   (value_type_conflict2 *)in_stack_ffffffffffffd298);
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)local_2c0,
                            (size_type)local_318);
        local_310 = (pointer)((double)local_310 - *pvVar3);
      }
      peVar10 = (errorStruct *)local_2c0;
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd2a0,
                 (value_type_conflict2 *)in_stack_ffffffffffffd298);
    }
    else {
      peVar10 = &painCave;
      snprintf(painCave.errMsg,2000,
               "randomBuilder can\'t figure out molFractions for all of the components in the <MetaData> block."
              );
      painCave.isFatal = 1;
      simError();
    }
    local_320 = (pointer)0x0;
    for (local_328 = (_Base_ptr)0x0; local_328 < local_2f8;
        local_328 = (_Base_ptr)((long)&local_328->_M_color + 1)) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd290,
                          CONCAT44(in_stack_ffffffffffffd28c,in_stack_ffffffffffffd288));
      if (*pvVar3 <= 0.0 && *pvVar3 != 0.0) {
        snprintf(painCave.errMsg,2000,"One of the requested molFractions was less than zero!");
        painCave.isFatal = 1;
        simError();
      }
      in_stack_ffffffffffffd420 =
           (MoLocator *)
           std::vector<double,_std::allocator<double>_>::at
                     ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd290,
                      CONCAT44(in_stack_ffffffffffffd28c,in_stack_ffffffffffffd288));
      if (1.0 < (double)in_stack_ffffffffffffd420->myStamp) {
        in_stack_ffffffffffffd418 = &painCave;
        snprintf(painCave.errMsg,2000,"One of the requested molFractions was greater than one!");
        in_stack_ffffffffffffd418->isFatal = 1;
        simError();
      }
      peVar10 = (errorStruct *)local_2c0;
      in_stack_ffffffffffffd410 =
           (Vector3d *)
           std::vector<double,_std::allocator<double>_>::at
                     ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd290,
                      CONCAT44(in_stack_ffffffffffffd28c,in_stack_ffffffffffffd288));
      local_320 = (pointer)((in_stack_ffffffffffffd410->super_Vector<double,_3U>).data_[0] +
                           (double)local_320);
    }
    std::abs((int)peVar10);
    mol_00 = extraout_XMM0_Qa;
    if (1e-06 < (double)extraout_XMM0_Qa) {
      snprintf(painCave.errMsg,2000,"The sum of molFractions was not close enough to 1.0");
      painCave.isFatal = 1;
      simError();
    }
    local_32c = local_254;
    for (local_338 = (pointer)0x0; local_338 < (pointer)((long)&local_2f8[-1]._M_right + 7U);
        local_338 = (pointer)((long)local_338 + 1)) {
      dVar9 = (double)local_254;
      pvVar3 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd290,
                          CONCAT44(in_stack_ffffffffffffd28c,in_stack_ffffffffffffd288));
      local_33c = (int)(dVar9 * *pvVar3);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffd290,
                 (value_type_conflict1 *)
                 CONCAT44(in_stack_ffffffffffffd28c,in_stack_ffffffffffffd288));
      pvVar4 = std::vector<int,_std::allocator<int>_>::at
                         ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffd290,
                          CONCAT44(in_stack_ffffffffffffd28c,in_stack_ffffffffffffd288));
      local_32c = local_32c - *pvVar4;
    }
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffd2a0,
               (value_type_conflict1 *)in_stack_ffffffffffffd298);
    local_340 = 0;
    local_348 = 0.0;
    for (local_350 = (_Base_ptr)0x0; local_350 < local_2f8;
        local_350 = (_Base_ptr)((long)&local_350->_M_color + 1)) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::at
                         ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffd290,
                          CONCAT44(in_stack_ffffffffffffd28c,in_stack_ffffffffffffd288));
      iVar1 = *pvVar4;
      dVar9 = (double)local_254;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_2c0,(size_type)local_350)
      ;
      *pvVar3 = (double)iVar1 / dVar9;
      pvVar4 = std::vector<int,_std::allocator<int>_>::at
                         ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffd290,
                          CONCAT44(in_stack_ffffffffffffd28c,in_stack_ffffffffffffd288));
      local_340 = local_340 + *pvVar4;
      OpenMD::SimInfo::getMoleculeStamp
                ((SimInfo *)in_stack_ffffffffffffd290,in_stack_ffffffffffffd28c);
      OpenMD::SimInfo::getForceField(local_288);
      local_358 = (_Base_ptr)
                  OpenMD::MoLocator::getMolMass(in_stack_ffffffffffffd2f0,in_stack_ffffffffffffd2e8)
      ;
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd290,
                 (value_type_conflict2 *)
                 CONCAT44(in_stack_ffffffffffffd28c,in_stack_ffffffffffffd288));
      pvVar4 = std::vector<int,_std::allocator<int>_>::at
                         ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffd290,
                          CONCAT44(in_stack_ffffffffffffd28c,in_stack_ffffffffffffd288));
      iVar1 = *pvVar4;
      pvVar3 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd290,
                          CONCAT44(in_stack_ffffffffffffd28c,in_stack_ffffffffffffd288));
      local_348 = (double)iVar1 * *pvVar3 + local_348;
    }
    local_360 = (_Base_ptr)(local_348 / (double)local_340);
    if (local_340 != local_254) {
      snprintf(painCave.errMsg,2000,
               "Computed total number of molecules is not equal to the number of lattice sites!");
      painCave.isFatal = 1;
      simError();
    }
    local_178 = (pointer)pow(((double)local_244 * 1.661 * (double)local_360) / (double)local_1a0,
                             0.3333333333333333);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd2a0,
               (value_type_conflict2 *)in_stack_ffffffffffffd298);
    (*local_170->_vptr_Lattice[3])(local_170,local_190);
    OpenMD::Lattice::getLatticePointsOrt
              ((Lattice *)CONCAT44(in_stack_ffffffffffffd28c,in_stack_ffffffffffffd288));
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator=
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               in_stack_ffffffffffffd2a0,
               (vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               in_stack_ffffffffffffd298);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::~vector
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               in_stack_ffffffffffffd2a0);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               0x133413);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               0x133420);
    for (local_418._108_4_ = 0; (int)local_418._108_4_ < local_1a4;
        local_418._108_4_ = local_418._108_4_ + 1) {
      for (local_418._104_4_ = 0; (int)local_418._104_4_ < local_1a8;
          local_418._104_4_ = local_418._104_4_ + 1) {
        for (local_418._100_4_ = 0; (int)local_418._100_4_ < local_1ac;
            local_418._100_4_ = local_418._100_4_ + 1) {
          OpenMD::Lattice::getLatticePointsPos
                    ((Lattice *)in_stack_ffffffffffffd2f0,
                     (vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                     in_stack_ffffffffffffd2e8,(int)((ulong)in_stack_ffffffffffffd2e0 >> 0x20),
                     (int)in_stack_ffffffffffffd2e0,(int)((ulong)in_stack_ffffffffffffd2d8 >> 0x20))
          ;
          for (local_418._96_4_ = 0; (int)local_418._96_4_ < local_244;
              local_418._96_4_ = local_418._96_4_ + 1) {
            std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
            operator[](&local_228,(long)(int)local_418._96_4_);
            std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
            push_back((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                      in_stack_ffffffffffffd2a0,in_stack_ffffffffffffd298);
            std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
            operator[](&local_240,(long)(int)local_418._96_4_);
            std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
            push_back((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                      in_stack_ffffffffffffd2a0,in_stack_ffffffffffffd298);
          }
        }
      }
    }
    std::__cxx11::string::operator=(local_168,(char *)local_f8);
    std::vector<int,_std::allocator<int>_>::vector
              (in_stack_ffffffffffffd2e0,in_stack_ffffffffffffd2d8);
    createMdFile(in_stack_0000d700,in_stack_0000d6f8,in_stack_0000d6f0);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffd2a0);
    if (local_288 != (SimInfo *)0x0) {
      (*local_288->_vptr_SimInfo[1])();
    }
    OpenMD::SimCreator::SimCreator((SimCreator *)0x13361c);
    local_418._24_8_ =
         OpenMD::SimCreator::createSim(in_stack_0000dcc0,in_stack_0000dcb8,(bool)in_stack_0000dcb7);
    dVar9 = (double)local_1a4 * (double)local_178;
    pdVar5 = OpenMD::RectMatrix<double,_3U,_3U>::operator()(&local_1f8,0,0);
    *pdVar5 = dVar9;
    pdVar5 = OpenMD::RectMatrix<double,_3U,_3U>::operator()(&local_1f8,0,1);
    *pdVar5 = 0.0;
    pdVar5 = OpenMD::RectMatrix<double,_3U,_3U>::operator()(&local_1f8,0,2);
    *pdVar5 = 0.0;
    pdVar5 = OpenMD::RectMatrix<double,_3U,_3U>::operator()(&local_1f8,1,0);
    *pdVar5 = 0.0;
    __last._M_current = (int *)((double)local_1a8 * (double)local_178);
    __first._M_current = (int *)OpenMD::RectMatrix<double,_3U,_3U>::operator()(&local_1f8,1,1);
    *(int **)__first._M_current = __last._M_current;
    __g = (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           *)OpenMD::RectMatrix<double,_3U,_3U>::operator()(&local_1f8,1,2);
    __g->_M_x[0] = 0;
    info = (SimInfo *)OpenMD::RectMatrix<double,_3U,_3U>::operator()(&local_1f8,2,0);
    info->_vptr_SimInfo = (_func_int **)0x0;
    filename = (string *)OpenMD::RectMatrix<double,_3U,_3U>::operator()(&local_1f8,2,1);
    *(double *)filename = 0.0;
    this_00 = (Snapshot *)((double)local_1ac * (double)local_178);
    pdVar5 = OpenMD::RectMatrix<double,_3U,_3U>::operator()(&local_1f8,2,2);
    *pdVar5 = (double)this_00;
    this = OpenMD::SimInfo::getSnapshotManager((SimInfo *)local_418._24_8_);
    OpenMD::SnapshotManager::getCurrentSnapshot(this);
    OpenMD::Snapshot::setHmat(this_00,(Mat3x3d *)this);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1338a6);
    for (local_420 = 0;
        sVar6 = std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
                size(local_390), local_420 < sVar6; local_420 = local_420 + 1) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffd290,
                 (value_type_conflict1 *)
                 CONCAT44(in_stack_ffffffffffffd28c,in_stack_ffffffffffffd288));
    }
    std::random_device::random_device
              ((random_device *)CONCAT44(in_stack_ffffffffffffd2d4,in_stack_ffffffffffffd2d0));
    std::random_device::operator()((random_device *)0x133994);
    std::
    mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
    ::mersenne_twister_engine
              (in_stack_ffffffffffffd290,
               CONCAT44(in_stack_ffffffffffffd28c,in_stack_ffffffffffffd288));
    std::vector<int,_std::allocator<int>_>::begin
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_ffffffffffffd28c,in_stack_ffffffffffffd288));
    std::vector<int,_std::allocator<int>_>::end
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_ffffffffffffd28c,in_stack_ffffffffffffd288));
    std::
    shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&>
              (__first,__last,__g);
    local_2b54 = 0;
    for (local_2b60 = (_Base_ptr)0x0; local_2b60 < local_2f8;
        local_2b60 = (_Base_ptr)((long)&local_2b60->_M_color + 1)) {
      piVar7 = (pointer)operator_new(0x30);
      OpenMD::SimInfo::getMoleculeStamp
                ((SimInfo *)in_stack_ffffffffffffd290,in_stack_ffffffffffffd28c);
      OpenMD::SimInfo::getForceField((SimInfo *)local_418._24_8_);
      OpenMD::MoLocator::MoLocator
                ((MoLocator *)in_stack_ffffffffffffd2b0,in_stack_ffffffffffffd2a8,
                 (ForceField *)in_stack_ffffffffffffd2a0);
      local_2b64 = 0;
      local_210 = piVar7;
      while (iVar1 = local_2b64,
            pvVar4 = std::vector<int,_std::allocator<int>_>::at
                               ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffd290,
                                CONCAT44(in_stack_ffffffffffffd28c,in_stack_ffffffffffffd288)),
            iVar1 < *pvVar4) {
        OpenMD::SimInfo::getMoleculeByGlobalIndex
                  (in_stack_ffffffffffffd2b0,(int)((ulong)in_stack_ffffffffffffd2a8 >> 0x20));
        in_stack_ffffffffffffd2b0 = (SimInfo *)local_418;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffd2b0,
                            (long)local_2b54);
        std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
                  (local_390,(long)*pvVar4);
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffd2b0,
                            (long)local_2b54);
        std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
                  ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                   (local_418 + 0x70),(long)*pvVar4);
        OpenMD::MoLocator::placeMol
                  (in_stack_ffffffffffffd420,(Vector3d *)in_stack_ffffffffffffd418,
                   in_stack_ffffffffffffd410,mol_00);
        local_2b54 = local_2b54 + 1;
        local_2b64 = local_2b64 + 1;
      }
    }
    pvVar8 = operator_new(0x60);
    OpenMD::DumpWriter::DumpWriter((DumpWriter *)__g,info,filename);
    local_250 = pvVar8;
    if (pvVar8 == (void *)0x0) {
      in_stack_ffffffffffffd2a0 = &painCave;
      snprintf(painCave.errMsg,2000,"error in creating DumpWriter");
      (((ForceField *)in_stack_ffffffffffffd2a0)->forceFieldOptions_).DelayedParameterCalculation.
      super_ParameterBase.optional_ = true;
      (((ForceField *)in_stack_ffffffffffffd2a0)->forceFieldOptions_).DelayedParameterCalculation.
      super_ParameterBase.defaultValue_ = false;
      (((ForceField *)in_stack_ffffffffffffd2a0)->forceFieldOptions_).DelayedParameterCalculation.
      super_ParameterBase.empty_ = false;
      (((ForceField *)in_stack_ffffffffffffd2a0)->forceFieldOptions_).DelayedParameterCalculation.
      super_ParameterBase.field_0x2b = 0;
      simError();
    }
    OpenMD::DumpWriter::writeDump((DumpWriter *)0x133ca5);
    if (local_250 != (void *)0x0) {
      pvVar8 = local_250;
      OpenMD::DumpWriter::~DumpWriter((DumpWriter *)in_stack_ffffffffffffd290);
      operator_delete(pvVar8,0x60);
    }
    uVar2 = std::__cxx11::string::c_str();
    peVar10 = &painCave;
    snprintf(painCave.errMsg,2000,"A new OpenMD file called \"%s\" has been generated.\n",uVar2);
    peVar10->isFatal = 0;
    peVar10->severity = 3;
    simError();
    local_4 = 0;
    std::random_device::~random_device((random_device *)0x133d3a);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffd2a0);
    OpenMD::SimCreator::~SimCreator((SimCreator *)0x133d54);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::~vector
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               in_stack_ffffffffffffd2a0);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::~vector
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               in_stack_ffffffffffffd2a0);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffd2a0);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd2a0);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd2a0);
    std::vector<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>::~vector
              ((vector<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_> *)
               in_stack_ffffffffffffd2a0);
    OpenMD::SimCreator::~SimCreator((SimCreator *)0x133daf);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::~vector
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               in_stack_ffffffffffffd2a0);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::~vector
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               in_stack_ffffffffffffd2a0);
    OpenMD::SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x133dd6);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd2a0);
    std::__cxx11::string::~string(local_168);
    std::__cxx11::string::~string(local_148);
    std::__cxx11::string::~string(local_128);
    return local_4;
  }
  exit(1);
}

Assistant:

int main(int argc, char* argv[]) {
  registerLattice();

  gengetopt_args_info args_info;
  std::string latticeType;
  std::string inputFileName;
  std::string outputFileName;
  Lattice* simpleLat;
  RealType latticeConstant;
  std::vector<RealType> lc;
  const RealType rhoConvertConst = 1.661;
  RealType density;
  int nx, ny, nz;
  Mat3x3d hmat;
  MoLocator* locator;
  std::vector<Vector3d> latticePos;
  std::vector<Vector3d> latticeOrt;
  int nMolPerCell;
  DumpWriter* writer;

  // parse command line arguments
  if (cmdline_parser(argc, argv, &args_info) != 0) exit(1);

  density = args_info.density_arg;

  // get lattice type
  latticeType = "FCC";
  if (args_info.lattice_given) { latticeType = args_info.lattice_arg; }

  simpleLat = LatticeFactory::getInstance().createLattice(latticeType);

  if (simpleLat == NULL) {
    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "Lattice Factory can not create %s lattice\n",
             latticeType.c_str());
    painCave.isFatal = 1;
    simError();
  }
  nMolPerCell = simpleLat->getNumSitesPerCell();

  // get the number of unit cells in each direction:

  nx = args_info.nx_arg;

  if (nx <= 0) {
    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "The number of unit cells in the x direction "
             "must be greater than 0.");
    painCave.isFatal = 1;
    simError();
  }

  ny = args_info.ny_arg;

  if (ny <= 0) {
    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "The number of unit cells in the y direction "
             "must be greater than 0.");
    painCave.isFatal = 1;
    simError();
  }

  nz = args_info.nz_arg;

  if (nz <= 0) {
    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "The number of unit cells in the z direction "
             "must be greater than 0.");
    painCave.isFatal = 1;
    simError();
  }

  int nSites = nMolPerCell * nx * ny * nz;

  // get input file name
  if (args_info.inputs_num)
    inputFileName = args_info.inputs[0];
  else {
    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "No input .omd file name was specified "
             "on the command line");
    painCave.isFatal = 1;
    simError();
  }

  // parse md file and set up the system

  SimCreator oldCreator;
  SimInfo* oldInfo   = oldCreator.createSim(inputFileName, false);
  Globals* simParams = oldInfo->getSimParams();

  // Calculate lattice constant (in Angstroms)

  std::vector<Component*> components = simParams->getComponents();
  std::vector<RealType> molFractions;
  std::vector<RealType> molecularMasses;
  std::vector<int> nMol;
  std::size_t nComponents = components.size();

  if (nComponents == 1) {
    molFractions.push_back(1.0);
  } else {
    if (args_info.molFraction_given == nComponents) {
      for (std::size_t i = 0; i < nComponents; i++) {
        molFractions.push_back(args_info.molFraction_arg[i]);
      }
    } else if (args_info.molFraction_given == nComponents - 1) {
      RealType remainingFraction = 1.0;
      for (std::size_t i = 0; i < nComponents - 1; i++) {
        molFractions.push_back(args_info.molFraction_arg[i]);
        remainingFraction -= molFractions[i];
      }
      molFractions.push_back(remainingFraction);
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "randomBuilder can't figure out molFractions "
               "for all of the components in the <MetaData> block.");
      painCave.isFatal = 1;
      simError();
    }
  }

  // do some sanity checking:

  RealType totalFraction = 0.0;

  for (std::size_t i = 0; i < nComponents; i++) {
    if (molFractions.at(i) < 0.0) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "One of the requested molFractions was"
               " less than zero!");
      painCave.isFatal = 1;
      simError();
    }
    if (molFractions.at(i) > 1.0) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "One of the requested molFractions was"
               " greater than one!");
      painCave.isFatal = 1;
      simError();
    }
    totalFraction += molFractions.at(i);
  }
  if (abs(totalFraction - 1.0) > 1e-6) {
    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "The sum of molFractions was not close enough to 1.0");
    painCave.isFatal = 1;
    simError();
  }

  int remaining = nSites;
  for (std::size_t i = 0; i < nComponents - 1; i++) {
    nMol.push_back(int((RealType)nSites * molFractions.at(i)));
    remaining -= nMol.at(i);
  }
  nMol.push_back(remaining);

  // recompute actual mol fractions and perform final sanity check:

  int totalMolecules = 0;
  RealType totalMass = 0.0;
  for (std::size_t i = 0; i < nComponents; i++) {
    molFractions[i] = (RealType)(nMol.at(i)) / (RealType)nSites;
    totalMolecules += nMol.at(i);
    molecularMasses.push_back(MoLocator::getMolMass(
        oldInfo->getMoleculeStamp(i), oldInfo->getForceField()));
    totalMass += (RealType)(nMol.at(i)) * molecularMasses.at(i);
  }
  RealType avgMass = totalMass / (RealType)totalMolecules;

  if (totalMolecules != nSites) {
    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "Computed total number of molecules is not equal "
             "to the number of lattice sites!");
    painCave.isFatal = 1;
    simError();
  }

  latticeConstant = pow(rhoConvertConst * nMolPerCell * avgMass / density,
                        (RealType)(1.0 / 3.0));

  // Set the lattice constant

  lc.push_back(latticeConstant);
  simpleLat->setLatticeConstant(lc);

  // Calculate the lattice sites and fill the lattice vector.

  // Get the standard orientations of the cell sites

  latticeOrt = simpleLat->getLatticePointsOrt();

  vector<Vector3d> sites;
  vector<Vector3d> orientations;

  for (int i = 0; i < nx; i++) {
    for (int j = 0; j < ny; j++) {
      for (int k = 0; k < nz; k++) {
        // Get the position of the cell sites

        simpleLat->getLatticePointsPos(latticePos, i, j, k);

        for (int l = 0; l < nMolPerCell; l++) {
          sites.push_back(latticePos[l]);
          orientations.push_back(latticeOrt[l]);
        }
      }
    }
  }

  outputFileName = args_info.output_arg;

  // create a new .omd file on the fly which corrects the number of molecules

  createMdFile(inputFileName, outputFileName, nMol);

  delete oldInfo;

  // We need to read in the new SimInfo object, then Parse the
  // md file and set up the system

  SimCreator newCreator;
  SimInfo* newInfo = newCreator.createSim(outputFileName, false);

  // fill Hmat

  hmat(0, 0) = nx * latticeConstant;
  hmat(0, 1) = 0.0;
  hmat(0, 2) = 0.0;

  hmat(1, 0) = 0.0;
  hmat(1, 1) = ny * latticeConstant;
  hmat(1, 2) = 0.0;

  hmat(2, 0) = 0.0;
  hmat(2, 1) = 0.0;
  hmat(2, 2) = nz * latticeConstant;

  // Set Hmat

  newInfo->getSnapshotManager()->getCurrentSnapshot()->setHmat(hmat);

  // place the molecules

  // Randomize a vector of ints:

  vector<int> ids;
  for (std::size_t i = 0; i < sites.size(); i++)
    ids.push_back(i);

  /* Set up the random number generator engine */
  std::random_device rd;   // Non-deterministic, uniformly-distributed integer
                           // random number generator
  std::mt19937 gen(rd());  // 32-bit Mersenne Twister random number engine

  std::shuffle(ids.begin(), ids.end(), gen);

  Molecule* mol;
  int l = 0;
  for (std::size_t i = 0; i < nComponents; i++) {
    locator =
        new MoLocator(newInfo->getMoleculeStamp(i), newInfo->getForceField());
    for (int n = 0; n < nMol.at(i); n++) {
      mol = newInfo->getMoleculeByGlobalIndex(l);
      locator->placeMol(sites[ids[l]], orientations[ids[l]], mol);
      l++;
    }
  }

  // Create DumpWriter and write out the coordinates

  writer = new DumpWriter(newInfo, outputFileName);

  if (writer == NULL) {
    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "error in creating DumpWriter");
    painCave.isFatal = 1;
    simError();
  }

  writer->writeDump();

  // deleting the writer will put the closing at the end of the dump file.

  delete writer;

  snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
           "A new OpenMD file called \"%s\" has been "
           "generated.\n",
           outputFileName.c_str());
  painCave.isFatal  = 0;
  painCave.severity = OPENMD_INFO;
  simError();
  return 0;
}